

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::dispose
          (ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
           *this)

{
  DataLocationUsage *pDVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *pRVar2;
  DataLocationUsage *pDVar3;
  
  pDVar1 = this->ptr;
  if (pDVar1 != (DataLocationUsage *)0x0) {
    pRVar2 = this->pos;
    pDVar3 = this->endPtr;
    this->endPtr = (DataLocationUsage *)0x0;
    this->ptr = (DataLocationUsage *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                 *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pDVar1,8,(long)pRVar2 - (long)pDVar1 >> 3,
               (long)pDVar3 - (long)pDVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }